

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void sysbvm_gc_iterateRoots
               (sysbvm_context_t *context,void *userdata,
               sysbvm_GCRootIterationFunction_t *iterationFunction)

{
  size_t sVar1;
  _Bool _Var2;
  uint8_t *puVar3;
  sysbvm_pic_t *psVar4;
  sysbvm_tuple_t *psVar5;
  sysbvm_stackFrameRecord_t *stackBottomRecord;
  sysbvm_picEntry_t *picEntry;
  size_t j;
  sysbvm_pic_t *pic;
  size_t i_2;
  sysbvm_pic_t *pics;
  size_t picCount;
  sysbvm_chunkedAllocatorIterator_t iterator_1;
  size_t i_1;
  sysbvm_tuple_t *entries;
  size_t entryCount;
  sysbvm_chunkedAllocatorIterator_t iterator;
  size_t i;
  size_t contextRootCount;
  sysbvm_tuple_t *contextRoots;
  sysbvm_GCRootIterationFunction_t *iterationFunction_local;
  void *userdata_local;
  sysbvm_context_t *context_local;
  
  for (iterator.data = (uint8_t *)0x0; iterator.data < (uint8_t *)0x43b;
      iterator.data = iterator.data + 1) {
    (*iterationFunction)(userdata,(context->roots).immediateTypeTable + (long)iterator.data);
  }
  sysbvm_chunkedAllocatorIterator_begin
            (&(context->heap).gcRootTableAllocator,(sysbvm_chunkedAllocatorIterator_t *)&entryCount)
  ;
  while( true ) {
    _Var2 = sysbvm_chunkedAllocatorIterator_isValid
                      ((sysbvm_chunkedAllocatorIterator_t *)&entryCount);
    sVar1 = iterator.size;
    if (!_Var2) break;
    puVar3 = (uint8_t *)((ulong)iterator.chunk >> 3);
    for (iterator_1.data = (uint8_t *)0x0; iterator_1.data < puVar3;
        iterator_1.data = iterator_1.data + 1) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(sVar1 + (long)iterator_1.data * 8));
    }
    sysbvm_chunkedAllocatorIterator_advance((sysbvm_chunkedAllocatorIterator_t *)&entryCount);
  }
  sysbvm_chunkedAllocatorIterator_begin
            (&(context->heap).picTableAllocator,(sysbvm_chunkedAllocatorIterator_t *)&picCount);
  while( true ) {
    _Var2 = sysbvm_chunkedAllocatorIterator_isValid((sysbvm_chunkedAllocatorIterator_t *)&picCount);
    sVar1 = iterator_1.size;
    if (!_Var2) break;
    psVar4 = (sysbvm_pic_t *)((ulong)iterator_1.chunk / 0x68);
    for (pic = (sysbvm_pic_t *)0x0; pic < psVar4;
        pic = (sysbvm_pic_t *)((long)&pic->preSequence + 1)) {
      for (picEntry = (sysbvm_picEntry_t *)0x0; picEntry < (sysbvm_picEntry_t *)0x4;
          picEntry = (sysbvm_picEntry_t *)((long)&picEntry->selector + 1)) {
        psVar5 = (sysbvm_tuple_t *)(sVar1 + (long)pic * 0x68 + 8 + (long)picEntry * 0x18);
        (*iterationFunction)(userdata,psVar5);
        (*iterationFunction)(userdata,psVar5 + 1);
        (*iterationFunction)(userdata,psVar5 + 2);
      }
    }
    sysbvm_chunkedAllocatorIterator_advance((sysbvm_chunkedAllocatorIterator_t *)&picCount);
  }
  stackBottomRecord = sysbvm_stackFrame_getActiveRecord();
  sysbvm_stackFrame_iterateGCRootsInStackWith(stackBottomRecord,userdata,iterationFunction);
  return;
}

Assistant:

SYSBVM_API void sysbvm_gc_iterateRoots(sysbvm_context_t *context, void *userdata, sysbvm_GCRootIterationFunction_t iterationFunction)
{
    // Context roots.
    {
        sysbvm_tuple_t *contextRoots = (sysbvm_tuple_t*)&context->roots;
        size_t contextRootCount = sizeof(context->roots) / sizeof(sysbvm_tuple_t);
        for(size_t i = 0; i < contextRootCount; ++i)
            iterationFunction(userdata, &contextRoots[i]);
    }

    // GC Root table
    {
        sysbvm_chunkedAllocatorIterator_t iterator;
        for(sysbvm_chunkedAllocatorIterator_begin(&context->heap.gcRootTableAllocator, &iterator);
            sysbvm_chunkedAllocatorIterator_isValid(&iterator);
            sysbvm_chunkedAllocatorIterator_advance(&iterator))
        {
            size_t entryCount = iterator.size / sizeof(sysbvm_tuple_t);
            sysbvm_tuple_t *entries = (sysbvm_tuple_t*)iterator.data;
            for(size_t i = 0; i < entryCount; ++i)
                iterationFunction(userdata, entries + i);
        }
    }

    // PIC table
    {
        sysbvm_chunkedAllocatorIterator_t iterator;
        for(sysbvm_chunkedAllocatorIterator_begin(&context->heap.picTableAllocator, &iterator);
            sysbvm_chunkedAllocatorIterator_isValid(&iterator);
            sysbvm_chunkedAllocatorIterator_advance(&iterator))
        {
            size_t picCount = iterator.size / sizeof(sysbvm_pic_t);
            sysbvm_pic_t *pics = (sysbvm_pic_t*)iterator.data;
            for(size_t i = 0; i < picCount; ++i)
            {
                sysbvm_pic_t *pic = pics + i;
                for(size_t j = 0; j < SYSBVM_PIC_ENTRY_COUNT; ++j)
                {
                    sysbvm_picEntry_t *picEntry = pic->entries + j;
                    iterationFunction(userdata, &picEntry->selector);
                    iterationFunction(userdata, &picEntry->type);
                    iterationFunction(userdata, &picEntry->method);
                }
            }
        }
    }

    // Stack roots.
    sysbvm_stackFrame_iterateGCRootsInStackWith(sysbvm_stackFrame_getActiveRecord(), userdata, iterationFunction);
}